

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_pipeline(ConvolutionDepthWise_x86 *this,Option *opt)

{
  uint _h;
  _func_int *p_Var1;
  ulong uVar2;
  Layer *pLVar3;
  _func_int **pp_Var4;
  int _w;
  ParamDict pd;
  Mat local_78;
  
  pp_Var4 = this->_vptr_ConvolutionDepthWise_x86;
  p_Var1 = pp_Var4[-3];
  if (*(int *)(&this->field_0x160 + (long)p_Var1) != 0) {
    return 0;
  }
  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var1)) {
  case 1:
    pLVar3 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_78);
    (*pLVar3->_vptr_Layer[2])(pLVar3,&local_78);
    break;
  case 2:
    pLVar3 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_78);
    ParamDict::set((ParamDict *)&local_78,0,**(float **)(&this->field_0x118 + (long)p_Var1));
    (*pLVar3->_vptr_Layer[2])(pLVar3,&local_78);
    break;
  case 3:
    pLVar3 = create_layer(0x36);
    ParamDict::ParamDict((ParamDict *)&local_78);
    ParamDict::set((ParamDict *)&local_78,0,**(float **)(&this->field_0x118 + (long)p_Var1));
    ParamDict::set((ParamDict *)&local_78,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var1) + 4));
    (*pLVar3->_vptr_Layer[2])(pLVar3,&local_78);
    break;
  case 4:
    pLVar3 = create_layer(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_78);
    (*pLVar3->_vptr_Layer[2])(pLVar3,&local_78);
    break;
  case 5:
    pLVar3 = create_layer(0x47);
    ParamDict::ParamDict((ParamDict *)&local_78);
    (*pLVar3->_vptr_Layer[2])(pLVar3,&local_78);
    break;
  case 6:
    pLVar3 = create_layer(0x43);
    ParamDict::ParamDict((ParamDict *)&local_78);
    ParamDict::set((ParamDict *)&local_78,0,**(float **)(&this->field_0x118 + (long)p_Var1));
    ParamDict::set((ParamDict *)&local_78,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var1) + 4));
    (*pLVar3->_vptr_Layer[2])(pLVar3,&local_78);
    break;
  default:
    pLVar3 = (Layer *)0x0;
    goto LAB_0027734e;
  }
  ParamDict::~ParamDict((ParamDict *)&local_78);
  (*pLVar3->_vptr_Layer[4])(pLVar3,opt);
  pp_Var4 = this->_vptr_ConvolutionDepthWise_x86;
LAB_0027734e:
  this->activation = pLVar3;
  p_Var1 = pp_Var4[-3];
  if ((opt->use_int8_inference == true) && (*(long *)(&this->field_0x178 + (long)p_Var1) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  _w = *(int *)(&this->field_0xd8 + (long)p_Var1) * *(int *)(&this->field_0xd4 + (long)p_Var1);
  _h = *(uint *)(&this->field_0x108 + (long)p_Var1);
  uVar2 = (long)*(int *)(&this->field_0x104 + (long)p_Var1) / (long)(int)_h;
  uVar2 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / (long)_w;
  if ((_h == *(uint *)(&this->field_0xd0 + (long)p_Var1)) &&
     ((int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
           (long)((int)*(uint *)(&this->field_0xd0 + (long)p_Var1) / (int)_h)) * _h == _h)) {
    if (((_h & 3) == 0) && (opt->use_packing_layout != false)) {
      Mat::reshape(&local_78,(Mat *)(&this->field_0x168 + (long)p_Var1),_w,_h,(Allocator *)0x0);
      convert_packing(&local_78,&this->weight_data_packed,4,opt);
      if (local_78.refcount == (int *)0x0) {
        return 0;
      }
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount != 0) {
        return 0;
      }
      if (local_78.allocator != (Allocator *)0x0) {
        (*(local_78.allocator)->_vptr_Allocator[3])();
        return 0;
      }
      if (local_78.data == (void *)0x0) {
        return 0;
      }
      free(local_78.data);
      return 0;
    }
    if ((*(int *)(&this->field_0xd8 + (long)p_Var1) == 3 &&
         *(int *)(&this->field_0xd4 + (long)p_Var1) == 3) &&
       (*(int *)(&this->field_0xdc + (long)p_Var1) == 1)) {
      if ((*(int *)(&this->field_0xe0 + (long)p_Var1) == 1) &&
         ((*(int *)(&this->field_0xe4 + (long)p_Var1) == 1 &&
          (*(int *)(&this->field_0xe8 + (long)p_Var1) == 1)))) {
        return 0;
      }
      if (((*(int *)(&this->field_0xe0 + (long)p_Var1) == 1) &&
          (*(int *)(&this->field_0xe4 + (long)p_Var1) == 2)) &&
         (*(int *)(&this->field_0xe8 + (long)p_Var1) == 2)) {
        return 0;
      }
    }
  }
  create_group_ops(this,opt);
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack8
        if (elempack == 8)
        {
#if __AVX2__
            if (opt.use_weight_fp16_storage && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                Mat weight_data_r2 = weight_data.reshape(maxk, group);
                Mat weight_data_tmp;
                convert_packing(weight_data_r2, weight_data_tmp, 8, opt);
                ncnn::cast_float32_to_float16(weight_data_tmp, weight_data_packed, opt);
                return 0;
            }
            if (opt.use_weight_fp16_storage && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                Mat weight_data_r2 = weight_data.reshape(maxk, group);
                Mat weight_data_tmp;
                convert_packing(weight_data_r2, weight_data_tmp, 8, opt);
                ncnn::cast_float32_to_float16(weight_data_tmp, weight_data_packed, opt);
                return 0;
            }
#endif
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_packed, 8, opt);

            return 0;
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_packed, 4, opt);

            return 0;
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                return 0;
            }
        }
    }

    // group convolution
    create_group_ops(opt);

    return 0;
}